

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPListener.cpp
# Opt level: O1

bool __thiscall hwnet::TCPListener::_start(TCPListener *this,OnNewConn *onNewConn,OnError *onError)

{
  Poller *this_00;
  int iVar1;
  uint uVar2;
  int iVar3;
  socklen_t __len;
  Ptr local_48;
  long local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  
  iVar1 = socket((this->addr).family,1,6);
  this->fd = iVar1;
  if (-1 < iVar1) {
    SetNoBlock(iVar1,true);
    ReuseAddr(this->fd);
    uVar2 = (this->addr).addrType - 1;
    __len = 0;
    if (uVar2 < 3) {
      __len = *(socklen_t *)(&DAT_0011f240 + (ulong)uVar2 * 4);
    }
    iVar3 = bind(this->fd,(sockaddr *)&this->addr,__len);
    iVar1 = this->fd;
    if (iVar3 == 0) {
      iVar1 = listen(iVar1,0x1000);
      if (iVar1 == 0) {
        std::function<void_(const_std::shared_ptr<hwnet::TCPListener>_&,_int,_const_hwnet::Addr_&)>
        ::operator=(&this->onNewConn_,onNewConn);
        std::function<void_(const_std::shared_ptr<hwnet::TCPListener>_&,_int)>::operator=
                  (&this->onError_,onError);
        this_00 = this->poller_;
        std::__shared_ptr<hwnet::TCPListener,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<hwnet::TCPListener,void>
                  ((__shared_ptr<hwnet::TCPListener,(__gnu_cxx::_Lock_policy)2> *)&local_38,
                   (__weak_ptr<hwnet::TCPListener,_(__gnu_cxx::_Lock_policy)2> *)
                   &this->super_enable_shared_from_this<hwnet::TCPListener>);
        local_48.super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)(local_38 + 8);
        if (local_38 == 0) {
          local_48.super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
        }
        local_48.super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             p_Stack_30;
        local_38 = 0;
        p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        Poller::Add(this_00,&local_48,10);
        if (local_48.super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_48.super___shared_ptr<hwnet::Channel,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (p_Stack_30 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          return false;
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
        return false;
      }
      iVar1 = this->fd;
    }
    close(iVar1);
    this->fd = -1;
  }
  return false;
}

Assistant:

bool TCPListener::_start(const OnNewConn &onNewConn,const OnError &onError) {
	this->fd = ::socket(this->addr.Family(),SOCK_STREAM,IPPROTO_TCP);
	
	if(this->fd < 0){
		return false;
	}

	SetNoBlock(this->fd,true);

	ReuseAddr(this->fd);

	if(0 != bind(this->fd,addr.Address(),addr.AddrLen())) {
        ::close(this->fd);
        this->fd = -1;
		return false;
	}
	
	if(0 != listen(this->fd,SOMAXCONN)) {
		::close(this->fd);
		this->fd = -1;
		return false;
	}

	this->onNewConn_ = onNewConn;
	this->onError_   = onError;
	this->poller_->Add(shared_from_this(),Poller::Read | Poller::ET);
	return false;
}